

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_a64_insn(CPUARMState_conflict *env,DisasContext_conflict1 *s)

{
  target_ulong *ptVar1;
  abi_ptr addr;
  uc_struct_conflict2 *puVar2;
  hook *phVar3;
  ARMISARegisters *pAVar4;
  void *val;
  TCGContext_conflict1 *s_00;
  TCGBar TVar5;
  byte bVar6;
  _Bool _Var7;
  uint32_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uintptr_t o_3;
  TCGv_i32 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i64 pTVar14;
  AArch64DecodeFn **ppAVar15;
  uint64_t uVar16;
  TCGLabel *pTVar17;
  ARMCPRegInfo_conflict *val_00;
  TCGv_i32 pTVar18;
  TCGv_i64 dest;
  TCGv_i64 pTVar19;
  TCGv_i64 pTVar20;
  sbyte sVar21;
  uint uVar22;
  MemOp size;
  ulong uVar23;
  int32_t arg;
  int32_t arg_00;
  ulong uVar24;
  TCGv_ptr pTVar25;
  MemOp MVar26;
  uintptr_t o_6;
  byte bVar27;
  uint uVar28;
  uint32_t syndrome;
  list_item *plVar29;
  TCGBar mb_type;
  target_ulong tVar30;
  code *pcVar31;
  ARMMMUIdx AVar32;
  uint uVar33;
  TCGContext_conflict1 *pTVar34;
  uint val_01;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  MemOp MVar39;
  uintptr_t o_5;
  ulong uVar40;
  uint uVar41;
  uintptr_t o;
  TCGTemp *pTVar42;
  _Bool _Var43;
  uintptr_t o_1;
  TCGTemp *ts;
  long lVar44;
  uint uVar45;
  int iVar46;
  uintptr_t o_2;
  bool bVar47;
  bool bVar48;
  _Bool iss_sf;
  TCGContext_conflict1 *local_e8;
  TCGTemp *local_e0;
  TCGLabel *local_d0;
  int local_c0;
  uint local_b8;
  uint local_b0;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  addr = (s->base).pc_next;
  s->pc_curr = addr;
  iVar10 = s->sctlr_b;
  uVar8 = cpu_ldl_code_aarch64(env,addr);
  uVar11 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  if (iVar10 == 0) {
    uVar11 = uVar8;
  }
  uVar40 = (ulong)uVar11;
  s->insn = uVar11;
  ptVar1 = &(s->base).pc_next;
  *ptVar1 = *ptVar1 + 4;
  puVar2 = env->uc;
  uVar16 = s->pc_curr;
  _Var7 = _hook_exists_bounded(puVar2->hook[2].head,uVar16);
  if (_Var7) {
    pTVar34 = puVar2->tcg_ctx;
    gen_a64_set_pc_im_aarch64(pTVar34,uVar16);
    puVar2 = env->uc;
    tVar30 = s->pc_curr;
    pTVar12 = tcg_const_i32_aarch64(pTVar34,4);
    pTVar13 = tcg_const_i64_aarch64(pTVar34,(int64_t)puVar2);
    pTVar14 = tcg_const_i64_aarch64(pTVar34,tVar30);
    pTVar42 = (TCGTemp *)(pTVar13 + (long)pTVar34);
    ts = (TCGTemp *)(pTVar14 + (long)pTVar34);
    local_e0 = (TCGTemp *)(pTVar12 + (long)pTVar34);
    local_40 = (TCGTemp *)0x0;
    local_58 = pTVar42;
    local_50 = ts;
    local_48 = local_e0;
    if (puVar2->hooks_count[2] == 1) {
      plVar29 = (list_item *)(puVar2->hook + 2);
      while (plVar29 = plVar29->next, plVar29 != (list_item *)0x0) {
        phVar3 = (hook *)plVar29->data;
        if (phVar3->to_delete == false) {
          pTVar13 = tcg_const_i64_aarch64(pTVar34,(int64_t)phVar3->user_data);
          local_40 = (TCGTemp *)(pTVar13 + (long)pTVar34);
          (*puVar2->add_inline_hook)(puVar2,phVar3,&local_58,4);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar13 + (long)pTVar34));
        }
      }
    }
    else {
      pTVar12 = tcg_const_i32_aarch64(pTVar34,2);
      local_78 = local_e0;
      local_70 = (TCGTemp *)(pTVar12 + (long)pTVar34);
      local_68 = pTVar42;
      local_60 = ts;
      tcg_gen_callN_aarch64(pTVar34,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_78);
      tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
    }
    tcg_temp_free_internal_aarch64(pTVar34,ts);
    tcg_temp_free_internal_aarch64(pTVar34,pTVar42);
    tcg_temp_free_internal_aarch64(pTVar34,local_e0);
    check_exit_request_aarch64(pTVar34);
  }
  s->fp_access_checked = false;
  pAVar4 = s->isar;
  uVar8 = 1;
  if (((pAVar4->id_aa64pfr1 & 0xf) != 0) && ((s->base).num_insns == 1)) {
    uVar23 = (s->base).pc_first;
    AVar32 = s->mmu_idx & 0xf;
    uVar35 = (ulong)(AVar32 << 4);
    uVar36 = uVar23 >> ((byte)env->uc->init_target_page->bits & 0x3f) &
             *(ulong *)((long)env + (uVar35 - 0xd0)) >> 6;
    uVar24 = s->uc->init_target_page->mask;
    if (((uVar24 | 0x200) & *(ulong *)(*(long *)((long)env + (uVar35 - 200)) + 0x10 + uVar36 * 0x40)
        ) == (uVar23 & uVar24)) {
      _Var7 = (_Bool)((*(byte *)(*(long *)((long)env + (ulong)AVar32 * 0x2b8 + -0x1ec0) + 10 +
                                (uVar36 & 0xffffffff) * 0x10) & 0x10) >> 4);
    }
    else {
      _Var7 = false;
    }
    s->guarded_page = _Var7;
    if ((s->btype != 0) && (_Var7 != false)) {
      uVar9 = (uint)(byte)s->btype;
      if ((uVar11 & 0xfffff01f) == 0xd503201f) {
        uVar33 = uVar11 >> 5 & 0x7f;
        if ((short)uVar33 == 0x19) {
LAB_006285d8:
          if ((uVar9 == 3) && (s->bt != false)) {
LAB_006285fb:
            if ((s->mmu_idx == ARMMMUIdx_SE10_0) && (s->secure_routed_to_el3 != false)) {
              uVar8 = 3;
            }
            else if (1 < s->current_el) {
              uVar8 = s->current_el;
            }
            gen_exception_insn(s,s->pc_curr,1,uVar9 | 0x34000000,uVar8);
            return;
          }
        }
        else if (uVar33 != 0x26) {
          if (uVar33 == 0x22) {
            if (uVar9 == 3) goto LAB_006285fb;
          }
          else {
            if (uVar33 != 0x24) {
              if (uVar33 != 0x1b) goto LAB_006285fb;
              goto LAB_006285d8;
            }
            if (uVar9 == 2) goto LAB_006285fb;
          }
        }
      }
      else if (((uVar11 & 0xffe0001f) + 0x2be00000 & 0xffc0001f) != 0) goto LAB_006285fb;
    }
  }
  uVar9 = uVar11 >> 0x19;
  uVar33 = uVar11 >> 0x10;
  bVar27 = (byte)(uVar11 >> 0x18);
  switch(uVar9 & 0xf) {
  case 0:
  case 1:
  case 3:
    break;
  case 2:
    if (((pAVar4->id_aa64pfr0 & 0xf00000000) != 0) && (_Var7 = disas_sve_aarch64(s,uVar11), _Var7))
    goto switchD_0062a93b_caseD_4;
    break;
  default:
    uVar16 = s->pc_curr;
    puVar2 = s->uc;
    _Var7 = _hook_exists_bounded(puVar2->hook[10].head,uVar16);
    if ((_Var7) || (_Var7 = _hook_exists_bounded(puVar2->hook[0xb].head,uVar16), _Var7)) {
      gen_a64_set_pc_im_aarch64(puVar2->tcg_ctx,uVar16);
    }
    uVar9 = uVar11 >> 0x18 & 0x3f;
    if ((ushort)uVar9 < 0x3e) {
      if ((0x330000000000U >> uVar9 & 1) != 0) {
        uVar9 = uVar11 >> 0x1e;
        if (uVar9 == 3) break;
        pTVar34 = s->uc->tcg_ctx;
        if ((uVar11 >> 0x1a & 1) == 0) {
          if ((uVar11 & 0x40400000) == 0x40000000) break;
          uVar9 = uVar11 >> 0x1f;
          _Var7 = (_Bool)(bVar27 >> 6 & 1);
        }
        else {
          _Var7 = false;
        }
        switch(uVar11 >> 0x17 & 3) {
        case 0:
          if (_Var7 != false) goto switchD_00628654_caseD_0;
        case 2:
          bVar47 = false;
LAB_00629606:
          bVar48 = false;
          break;
        case 1:
          bVar47 = true;
          bVar48 = true;
          break;
        case 3:
          bVar47 = true;
          goto LAB_00629606;
        }
        if (((uVar11 >> 0x1a & 1) != 0) && (_Var43 = fp_access_check(s), !_Var43))
        goto switchD_0062a93b_caseD_4;
        iVar10 = uVar9 + 2;
        sVar21 = (sbyte)iVar10;
        lVar44 = ((long)(uVar40 << 0x2a) >> 0x39) << sVar21;
        pTVar13 = read_cpu_reg_sp_aarch64(s,uVar11 >> 5 & 0x1f,1);
        if (!bVar48) {
          tcg_gen_addi_i64_aarch64(pTVar34,pTVar13,pTVar13,lVar44);
        }
        uVar9 = uVar11 & 0x1f;
        uVar33 = uVar11 >> 10 & 0x1f;
        pTVar14 = clean_data_tbi(s,pTVar13);
        if ((uVar11 >> 0x1a & 1) == 0) {
          pTVar20 = cpu_reg_aarch64(s,uVar9);
          pTVar19 = cpu_reg_aarch64(s,uVar33);
          if ((uVar11 >> 0x16 & 1) == 0) {
            do_gpr_st(s,pTVar20,pTVar14,iVar10,false,0,false,false);
            tcg_gen_addi_i64_aarch64(pTVar34,pTVar14,pTVar14,1L << sVar21);
            do_gpr_st(s,pTVar19,pTVar14,iVar10,false,0,false,false);
          }
          else {
            dest = tcg_temp_new_i64(pTVar34);
            do_gpr_ld(s,dest,pTVar14,iVar10,_Var7,false,false,0,false,false);
            tcg_gen_addi_i64_aarch64(pTVar34,pTVar14,pTVar14,1L << sVar21);
            do_gpr_ld(s,pTVar19,pTVar14,iVar10,_Var7,false,false,0,false,false);
            tcg_gen_mov_i64_aarch64(pTVar34,pTVar20,dest);
            tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(dest + (long)pTVar34));
          }
        }
        else {
          if ((uVar11 >> 0x16 & 1) == 0) {
            do_fp_st(s,uVar9,pTVar14,iVar10);
          }
          else {
            do_fp_ld(s,uVar9,pTVar14,iVar10);
          }
          tcg_gen_addi_i64_aarch64(pTVar34,pTVar14,pTVar14,1L << sVar21);
          if ((uVar11 >> 0x16 & 1) == 0) {
            do_fp_st(s,uVar33,pTVar14,iVar10);
          }
          else {
            do_fp_ld(s,uVar33,pTVar14,iVar10);
          }
        }
        if (!bVar47) goto switchD_0062a93b_caseD_4;
        if (bVar48) {
          tcg_gen_addi_i64_aarch64(pTVar34,pTVar13,pTVar13,lVar44);
        }
        pTVar14 = s->uc->tcg_ctx->cpu_X[(ulong)(uVar11 >> 5) & 0x1f];
        goto LAB_00629d21;
      }
      if ((0x3300000000000000U >> uVar9 & 1) == 0) {
        if (uVar9 != 0x1c) goto LAB_00628ad1;
LAB_00628beb:
        pTVar34 = s->uc->tcg_ctx;
        uVar9 = uVar11 >> 0x1e;
        if ((uVar11 >> 0x1a & 1) == 0) {
          if (uVar9 == 3) goto switchD_0062a93b_caseD_4;
          uVar9 = uVar9 & 1;
          _Var7 = (_Bool)(bVar27 >> 7);
        }
        else {
          if (uVar9 == 3) break;
          _Var7 = fp_access_check(s);
          if (!_Var7) goto switchD_0062a93b_caseD_4;
          _Var7 = false;
        }
        pTVar13 = cpu_reg_aarch64(s,uVar11 & 0x1f);
        pTVar14 = tcg_const_i64_aarch64
                            (pTVar34,(long)(int)((int)(uVar11 << 8) >> 0xb & 0xfffffffc) +
                                     s->pc_curr);
        if ((uVar11 >> 0x1a & 1) == 0) {
          do_gpr_ld(s,pTVar13,pTVar14,uVar9 + 2,_Var7,false,true,uVar11 & 0x1f,0x3fffffff < uVar11,
                    false);
        }
        else {
          do_fp_ld(s,uVar11 & 0x1f,pTVar14,uVar9 + 2);
        }
        pTVar42 = (TCGTemp *)(pTVar14 + (long)pTVar34);
LAB_00629782:
        tcg_temp_free_internal_aarch64(pTVar34,pTVar42);
        goto switchD_0062a93b_caseD_4;
      }
      uVar41 = uVar11 & 0x1f;
      uVar9 = uVar11 >> 0x16;
      uVar28 = uVar9 & 3;
      MVar39 = uVar11 >> 0x1e;
      bVar6 = (byte)uVar9;
      if ((bVar27 & 3) == 1) {
        pTVar34 = s->uc->tcg_ctx;
        if ((uVar11 >> 0x1a & 1) == 0) {
          if (uVar28 == 2 && MVar39 == MO_64) goto switchD_0062a93b_caseD_4;
          if (-1 < (int)uVar11 || uVar28 != 3) {
            _Var7 = (_Bool)((byte)(uVar11 >> 0x17) & 1);
            if (MVar39 == MO_64) {
              _Var43 = false;
              MVar39 = MO_64;
            }
            else {
              _Var43 = (_Bool)(bVar6 & 1);
            }
            goto LAB_0062a10d;
          }
          goto switchD_0062938c_caseD_9;
        }
        MVar39 = MVar39 + (uVar9 & 2) * 2;
        if (MO_ASHIFT < MVar39) goto switchD_0062938c_caseD_9;
        _Var7 = fp_access_check(s);
        if (!_Var7) goto switchD_0062a93b_caseD_4;
        uVar28 = uVar9 & 1;
        _Var7 = false;
        _Var43 = false;
LAB_0062a10d:
        pTVar13 = read_cpu_reg_sp_aarch64(s,uVar11 >> 5 & 0x1f,1);
        tcg_gen_addi_i64_aarch64
                  (pTVar34,pTVar13,pTVar13,(ulong)((uVar11 >> 10 & 0xfff) << (sbyte)MVar39));
        pTVar13 = clean_data_tbi(s,pTVar13);
        if ((uVar11 >> 0x1a & 1) != 0) {
LAB_0062a167:
          if (uVar28 == 0) {
            do_fp_st(s,uVar41,pTVar13,MVar39);
          }
          else {
            do_fp_ld(s,uVar41,pTVar13,MVar39);
          }
          goto switchD_0062a93b_caseD_4;
        }
        pTVar14 = cpu_reg_aarch64(s,uVar41);
        iss_sf = MVar39 == MO_64;
        if (_Var7 != false) {
          iss_sf = (uVar11 >> 0x16 & 1) == 0;
        }
        if (uVar28 != 0) {
LAB_0062a1df:
          do_gpr_ld(s,pTVar14,pTVar13,MVar39,_Var7,_Var43,true,uVar41,iss_sf,false);
          goto switchD_0062a93b_caseD_4;
        }
        _Var7 = false;
        goto LAB_0062a730;
      }
      if ((uVar11 & 0x3000000) != 0) goto switchD_0062938c_caseD_9;
      if ((uVar11 >> 0x15 & 1) == 0) {
        uVar33 = uVar11 >> 10;
        uVar45 = uVar33 & 3;
        bVar47 = (uVar11 >> 0x1a & 1) == 0;
        pTVar34 = s->uc->tcg_ctx;
        if (bVar47) {
          if (uVar28 == 2 && MVar39 == MO_64) {
            if ((uVar33 & 3) == 0) goto switchD_0062a93b_caseD_4;
            break;
          }
          if (-1 < (int)uVar11 || uVar28 != 3) {
            bVar27 = (uVar9 & 3) == 0;
            _Var7 = (_Bool)((byte)(uVar11 >> 0x17) & 1);
            if (MVar39 == MO_64) {
              _Var43 = false;
              MVar39 = MO_64;
            }
            else {
              _Var43 = (_Bool)(bVar6 & 1);
            }
            goto LAB_0062a95c;
          }
        }
        else {
          MVar39 = MVar39 + (uVar9 & 2) * 2;
          if (uVar45 != 2 && MVar39 < MO_LESW) {
            _Var7 = fp_access_check(s);
            if (!_Var7) goto switchD_0062a93b_caseD_4;
            bVar27 = (byte)uVar28 ^ 1;
            _Var43 = false;
            _Var7 = false;
LAB_0062a95c:
            pTVar13 = read_cpu_reg_sp_aarch64(s,uVar11 >> 5 & 0x1f,1);
            local_b8 = uVar33 & 3;
            lVar44 = (long)((int)(uVar11 << 0xb) >> 0x17);
            if ((2U >> uVar45 & 1) == 0) {
              tcg_gen_addi_i64_aarch64(pTVar34,pTVar13,pTVar13,lVar44);
            }
            pTVar14 = clean_data_tbi(s,pTVar13);
            if ((uVar11 >> 0x1a & 1) == 0) {
              pTVar20 = cpu_reg_aarch64(s,uVar41);
              AVar32 = s->mmu_idx;
              if ((local_b8 == 2) && (s->unpriv == true)) {
                uVar9 = AVar32 - ARMMMUIdx_E10_1;
                if ((7 < uVar9) || ((0xdbU >> (uVar9 & 0x1f) & 1) == 0)) {
                  g_assertion_message_expr
                            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                             ,0x84,(char *)0x0);
                }
                AVar32 = *(ARMMMUIdx *)(&DAT_00b86b04 + (ulong)uVar9 * 4);
              }
              bVar48 = MVar39 == MO_64;
              if (_Var7 != false) {
                bVar48 = (uVar11 >> 0x16 & 1) == 0;
              }
              if ((bVar27 & 1) == 0) {
                do_gpr_ld_memidx(s,pTVar20,pTVar14,MVar39,_Var7,_Var43,AVar32 & 0xf,bVar47,uVar41,
                                 bVar48,false);
              }
              else {
                do_gpr_st_memidx(s,pTVar20,pTVar14,MVar39,AVar32 & 0xf,bVar47,uVar41,bVar48,false);
              }
            }
            else if ((bVar27 & 1) == 0) {
              do_fp_ld(s,uVar41,pTVar14,MVar39);
            }
            else {
              do_fp_st(s,uVar41,pTVar14,MVar39);
            }
            if ((uVar33 & 1) != 0) {
              pTVar14 = s->uc->tcg_ctx->cpu_X[(ulong)(uVar11 >> 5) & 0x1f];
              if ((2U >> (sbyte)uVar45 & 1) != 0) {
                tcg_gen_addi_i64_aarch64(pTVar34,pTVar13,pTVar13,lVar44);
              }
              tcg_gen_mov_i64_aarch64(pTVar34,pTVar14,pTVar13);
            }
            goto switchD_0062a93b_caseD_4;
          }
        }
        goto switchD_0062938c_caseD_9;
      }
      uVar45 = uVar11 >> 10;
      pTVar34 = s->uc->tcg_ctx;
      if (((ushort)uVar45 & 3) == 2) {
        if ((uVar11 >> 0xe & 1) != 0) {
          if ((uVar11 >> 0x1a & 1) == 0) {
            if (uVar28 == 2 && MVar39 == MO_64) goto switchD_0062a93b_caseD_4;
            if (-1 < (int)uVar11 || uVar28 != 3) {
              _Var7 = (_Bool)((byte)(uVar11 >> 0x17) & 1);
              if (MVar39 == MO_64) {
                _Var43 = false;
                MVar39 = MO_64;
              }
              else {
                _Var43 = (_Bool)(bVar6 & 1);
              }
              goto LAB_0062b35d;
            }
          }
          else {
            MVar39 = MVar39 + (uVar9 & 2) * 2;
            if (MVar39 < MO_LESW) {
              _Var7 = fp_access_check(s);
              if (!_Var7) goto switchD_0062a93b_caseD_4;
              uVar28 = uVar9 & 1;
              _Var43 = false;
              _Var7 = false;
LAB_0062b35d:
              pTVar13 = read_cpu_reg_sp_aarch64(s,uVar11 >> 5 & 0x1f,1);
              pTVar14 = read_cpu_reg_aarch64(s,uVar11 >> 0x10 & 0x1f,1);
              ext_and_shift_reg(pTVar34,pTVar14,pTVar14,uVar11 >> 0xd & 7,
                                (int)(uVar11 << 0x13) >> 0x1f & MVar39);
              tcg_gen_add_i64(pTVar34,pTVar13,pTVar13,pTVar14);
              pTVar13 = clean_data_tbi(s,pTVar13);
              if ((uVar11 >> 0x1a & 1) != 0) goto LAB_0062a167;
              pTVar14 = cpu_reg_aarch64(s,uVar41);
              iss_sf = MVar39 == MO_64;
              if (_Var7 != false) {
                iss_sf = (uVar11 >> 0x16 & 1) == 0;
              }
              if (uVar28 != 0) goto LAB_0062a1df;
              _Var7 = false;
              goto LAB_0062a730;
            }
          }
        }
        goto switchD_0062938c_caseD_9;
      }
      if ((uVar45 & 3) != 0) {
        if ((MVar39 == MO_64 && (uVar11 & 0x4000000) == 0) &&
           ((s->isar->id_aa64isar1 & 0xff000ff0) != 0)) {
          uVar9 = uVar11 >> 5 & 0x1f;
          pTVar13 = read_cpu_reg_sp_aarch64(s,uVar9,1);
          if (s->pauth_active == true) {
            if ((uVar11 >> 0x17 & 1) == 0) {
              gen_helper_autda(pTVar34,pTVar13,pTVar34->cpu_env,pTVar13,pTVar34->cpu_X[0x1f]);
            }
            else {
              gen_helper_autdb(pTVar34,pTVar13,pTVar34->cpu_env,pTVar13,pTVar34->cpu_X[0x1f]);
            }
          }
          tcg_gen_addi_i64_aarch64
                    (pTVar34,pTVar13,pTVar13,
                     (long)((ulong)(uVar11 >> 9 & 0xff8 | uVar45 & 0x1000) << 0x33) >> 0x33);
          pTVar14 = clean_data_tbi(s,pTVar13);
          pTVar20 = cpu_reg_aarch64(s,uVar41);
          do_gpr_ld(s,pTVar20,pTVar14,3,false,false,(uVar11 >> 0xb & 1) == 0,uVar41,true,false);
          if ((uVar11 >> 0xb & 1) == 0) goto switchD_0062a93b_caseD_4;
          pTVar14 = s->uc->tcg_ctx->cpu_X[uVar9];
          goto LAB_00629d21;
        }
        break;
      }
      if (((uVar11 >> 0x1a & 1) != 0) || ((s->isar->id_aa64isar0 & 0xf00000) == 0)) break;
      uVar9 = uVar11 >> 0xc & 0xf;
      if (0xc < uVar9) goto switchD_0062938c_caseD_9;
      switch(uVar9) {
      case 0:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_add_i64_aarch64;
        break;
      case 1:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_and_i64_aarch64;
        break;
      case 2:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_xor_i64_aarch64;
        break;
      case 3:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_or_i64_aarch64;
        break;
      case 4:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_smax_i64_aarch64;
        break;
      case 5:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_smin_i64_aarch64;
        break;
      case 6:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_umax_i64_aarch64;
        break;
      case 7:
        local_e0 = (TCGTemp *)tcg_gen_atomic_fetch_umin_i64_aarch64;
        break;
      case 8:
        local_e0 = (TCGTemp *)tcg_gen_atomic_xchg_i64_aarch64;
        break;
      default:
        goto switchD_0062938c_caseD_9;
      case 0xc:
        if ((((uVar11 & 0xc00000) == 0x800000) && ((uVar33 & 0x1f) == 0x1f)) &&
           ((s->isar->id_aa64isar1 & 0xf00000) != 0)) break;
        goto switchD_0062938c_caseD_9;
      }
      pTVar13 = clean_data_tbi(s,pTVar34->cpu_X[uVar11 >> 5 & 0x1f]);
      if (uVar9 == 0xc) {
        pTVar14 = cpu_reg_aarch64(s,uVar41);
        do_gpr_ld(s,pTVar14,pTVar13,MVar39,false,false,true,uVar41,MVar39 == MO_64,true);
        mb_type = TCG_BAR_LDAQ|TCG_MO_ALL;
LAB_0062b5c1:
        tcg_gen_mb_aarch64(pTVar34,mb_type);
      }
      else {
        pTVar14 = read_cpu_reg_aarch64(s,uVar33 & 0x1f,1);
        if (uVar9 == 1) {
          tcg_gen_not_i64_aarch64(pTVar34,pTVar14,pTVar14);
        }
        pTVar20 = cpu_reg_aarch64(s,uVar41);
        (*(code *)local_e0)(pTVar34,pTVar20,pTVar13,pTVar14,s->mmu_idx & 0xf,
                            MVar39 | s->be_data | MO_ALIGN);
      }
      goto switchD_0062a93b_caseD_4;
    }
LAB_00628ad1:
    if (uVar9 == 0x19) {
      if (((uVar11 & 0x200c00) != 0) || ((s->isar->id_aa64isar1 & 0xe00000) == 0)) break;
      pTVar34 = s->uc->tcg_ctx;
      MVar39 = uVar11 >> 0x1e;
      switch(uVar11 >> 0x16 & 3) {
      case 0:
        bVar47 = true;
        break;
      case 1:
        bVar47 = false;
        break;
      case 2:
        if (MVar39 == MO_64) goto switchD_00628654_caseD_0;
        local_e0._0_1_ = false;
LAB_0062a680:
        iss_sf = (uVar11 >> 0x16 & 1) == 0;
        _Var7 = true;
        bVar47 = false;
        goto LAB_0062a6b2;
      case 3:
        local_e0._0_1_ = true;
        if (-1 < (int)uVar11) goto LAB_0062a680;
        goto switchD_00628654_caseD_0;
      }
      iss_sf = MVar39 == MO_64;
      local_e0._0_1_ = false;
      _Var7 = false;
LAB_0062a6b2:
      uVar9 = uVar11 & 0x1f;
      pTVar13 = read_cpu_reg_sp_aarch64(s,uVar11 >> 5 & 0x1f,1);
      tcg_gen_addi_i64_aarch64(pTVar34,pTVar13,pTVar13,(long)((int)(uVar11 << 0xb) >> 0x17));
      pTVar13 = clean_data_tbi(s,pTVar13);
      if (bVar47) {
        tcg_gen_mb_aarch64(pTVar34,TCG_BAR_STRL|TCG_MO_ALL);
        pTVar14 = cpu_reg_aarch64(s,uVar9);
        _Var7 = true;
LAB_0062a730:
        do_gpr_st(s,pTVar14,pTVar13,MVar39,true,uVar11 & 0x1f,iss_sf,_Var7);
        goto switchD_0062a93b_caseD_4;
      }
      pTVar14 = cpu_reg_aarch64(s,uVar9);
      do_gpr_ld(s,pTVar14,pTVar13,MVar39,_Var7,local_e0._0_1_,true,uVar9,iss_sf,true);
      mb_type = TCG_BAR_LDAQ|TCG_MO_ALL;
      goto LAB_0062b5c1;
    }
    if (uVar9 != 0xc) {
      if (uVar9 != 0xd) {
        if (uVar9 == 0x18) goto LAB_00628beb;
        if (uVar9 == 8) {
          (*(code *)(&DAT_00b851a4 +
                    *(int *)(&DAT_00b851a4 + (ulong)(uVar11 >> 0x14 & 0xe | uVar11 >> 0xf & 1) * 4))
          )(s->uc->tcg_ctx,uVar40,uVar11 & 0x1f);
          return;
        }
        break;
      }
      if (((int)uVar11 < 0) || ((uVar11 & 0x1f0000) != 0 && (uVar11 >> 0x17 & 1) == 0)) break;
      local_e8 = s->uc->tcg_ctx;
      uVar38 = uVar11 >> 10 & 3;
      uVar41 = uVar11 >> 0xc & 1;
      uVar45 = uVar11 >> 0x1b & 8;
      uVar22 = uVar45 + uVar41 * 4;
      uVar9 = uVar22 + uVar38;
      uVar28 = uVar11 >> 0xe & 3;
      switch(uVar28) {
      case 0:
        bVar47 = false;
        break;
      case 1:
        if ((uVar11 >> 10 & 1) != 0) goto switchD_0062938c_caseD_9;
        uVar9 = uVar9 >> 1;
        uVar28 = 1;
LAB_0062a24c:
        bVar47 = false;
        break;
      case 2:
        if ((uVar11 >> 0xb & 1) == 0) {
          if ((uVar11 >> 10 & 1) == 0) {
            uVar9 = uVar22 >> 2;
            uVar28 = 2;
            bVar47 = false;
            break;
          }
          if (uVar41 == 0) {
            uVar9 = uVar11 >> 0x1e;
            uVar28 = 3;
            goto LAB_0062a24c;
          }
        }
        goto switchD_0062938c_caseD_9;
      case 3:
        bVar47 = true;
        uVar28 = uVar38;
        if (((byte)(uVar11 >> 0x16) & uVar41 == 0) == 0) goto switchD_0062938c_caseD_9;
      }
      local_b0 = uVar33 & 0x1f;
      _Var7 = fp_access_check(s);
      if (!_Var7) goto switchD_0062a93b_caseD_4;
      uVar41 = uVar11 >> 0x15 & 1;
      uVar33 = uVar11 >> 0xc & 2;
      pTVar13 = s->uc->tcg_ctx->cpu_X[uVar11 >> 5 & 0x1f];
      pTVar14 = clean_data_tbi(s,pTVar13);
      pTVar20 = tcg_const_i64_aarch64(local_e8,(ulong)(uint)(1 << (sbyte)uVar28));
      iVar10 = uVar41 + uVar33 + 1;
      while (bVar48 = iVar10 != 0, iVar10 = iVar10 + -1, bVar48) {
        uVar22 = (uint)uVar40 & 0x1f;
        if (bVar47) {
          pTVar19 = tcg_temp_new_i64(local_e8);
          tcg_gen_qemu_ld_i64_aarch64
                    (local_e8,pTVar19,pTVar14,(ulong)(s->mmu_idx & 0xf),s->be_data + uVar28);
          tcg_gen_gvec_dup_i64_aarch64
                    (local_e8,uVar28,uVar22 * 0x100 + 0xc10,uVar45 + 8,s->sve_len,pTVar19);
          tcg_temp_free_internal_aarch64(local_e8,(TCGTemp *)(pTVar19 + (long)local_e8));
        }
        else if ((uVar11 >> 0x16 & 1) == 0) {
          do_vec_st(s,uVar22,uVar9,pTVar14,uVar28,s->be_data);
        }
        else {
          do_vec_ld(s,uVar22,uVar9,pTVar14,uVar28,s->be_data);
        }
        tcg_gen_add_i64(local_e8,pTVar14,pTVar14,pTVar20);
        uVar40 = (ulong)(uVar22 + 1);
      }
      tcg_temp_free_internal_aarch64(local_e8,(TCGTemp *)(pTVar20 + (long)local_e8));
      if ((uVar11 >> 0x17 & 1) == 0) goto switchD_0062a93b_caseD_4;
      if (local_b0 == 0x1f) {
        tcg_gen_addi_i64_aarch64
                  (local_e8,pTVar13,pTVar13,(ulong)(uVar33 + uVar41 + 1 << (sbyte)uVar28));
        goto switchD_0062a93b_caseD_4;
      }
      pTVar14 = cpu_reg_aarch64(s,local_b0);
      goto LAB_0062b073;
    }
    if ((((uVar11 & 0x80200000) != 0) || ((uVar11 & 0x1f0000) != 0 && (uVar11 >> 0x17 & 1) == 0)) ||
       (uVar23 = (uVar40 & 0xffff) >> 0xc, 10 < (ushort)uVar23)) break;
    local_c0 = 4;
    local_e8 = s->uc->tcg_ctx;
    MVar26 = uVar11 >> 10 & MO_64;
    MVar39 = s->be_data;
    bVar47 = true;
    switch(uVar23) {
    case 0:
      goto switchD_00628f16_caseD_0;
    default:
      goto switchD_00628654_caseD_0;
    case 2:
      local_c0 = 1;
      local_b0 = 4;
      break;
    case 4:
      local_c0 = 3;
      goto switchD_00628f16_caseD_0;
    case 6:
      local_b0 = 3;
      goto LAB_0062acf0;
    case 7:
      local_b0 = 1;
      local_c0 = 1;
      break;
    case 8:
      local_c0 = 2;
switchD_00628f16_caseD_0:
      if (MVar26 == MO_64 && (uVar11 & 0x40000000) == 0) goto switchD_00628654_caseD_0;
      local_b0 = 1;
      bVar47 = false;
      break;
    case 10:
      local_b0 = 2;
LAB_0062acf0:
      local_c0 = 1;
    }
    _Var7 = fp_access_check(s);
    if (_Var7) {
      if ((uVar11 >> 10 & MO_64) == MO_8) {
        MVar39 = MVar26;
      }
      size = MO_64;
      if (MVar39 != MO_8) {
        size = MVar26;
      }
      if (!bVar47) {
        size = MVar26;
      }
      sVar21 = (sbyte)size;
      uVar9 = (uVar11 >> 0x1b & 8) + 8 >> sVar21;
      pTVar13 = s->uc->tcg_ctx->cpu_X[uVar11 >> 5 & 0x1f];
      pTVar14 = clean_data_tbi(s,pTVar13);
      pTVar20 = tcg_const_i64_aarch64(local_e8,(ulong)(uint)(1 << sVar21));
      local_b8 = uVar11;
      for (iVar10 = 0; iVar10 != local_b0; iVar10 = iVar10 + 1) {
        for (uVar28 = 0; iVar46 = local_c0, uVar41 = local_b8, uVar28 != uVar9; uVar28 = uVar28 + 1)
        {
          while (iVar46 != 0) {
            if ((uVar11 >> 0x16 & 1) == 0) {
              do_vec_st(s,uVar41 & 0x1f,uVar28,pTVar14,size,MVar39);
            }
            else {
              do_vec_ld(s,uVar41 & 0x1f,uVar28,pTVar14,size,MVar39);
            }
            tcg_gen_add_i64(local_e8,pTVar14,pTVar14,pTVar20);
            iVar46 = iVar46 + -1;
            uVar41 = uVar41 + 1;
          }
        }
        local_b8 = local_b8 + 1;
      }
      tcg_temp_free_internal_aarch64(local_e8,(TCGTemp *)(pTVar20 + (long)local_e8));
      if ((uVar11 >> 0x16 & 1) != 0) {
        iVar10 = local_b0 * local_c0;
        while (bVar47 = iVar10 != 0, iVar10 = iVar10 + -1, bVar47) {
          clear_vec_high(s,(_Bool)(bVar27 >> 6 & 1),(uint)uVar40 & 0x1f);
          uVar40 = (ulong)((uint)uVar40 + 1);
        }
      }
      if ((uVar11 >> 0x17 & 1) != 0) {
        if ((uVar33 & 0x1f) == 0x1f) {
          tcg_gen_addi_i64_aarch64
                    (local_e8,pTVar13,pTVar13,(ulong)(local_b0 * local_c0 * uVar9 << sVar21));
        }
        else {
          pTVar14 = cpu_reg_aarch64(s,uVar33 & 0x1f);
LAB_0062b073:
          tcg_gen_add_i64(local_e8,pTVar13,pTVar13,pTVar14);
        }
      }
    }
    goto switchD_0062a93b_caseD_4;
  case 5:
  case 0xd:
    disas_data_proc_reg(s,uVar11);
    goto switchD_0062a93b_caseD_4;
  case 7:
  case 0xf:
    if ((uVar11 & 0x50000000) == 0x10000000) {
      disas_data_proc_fp(s,uVar11);
      goto switchD_0062a93b_caseD_4;
    }
    for (ppAVar15 = &data_proc_simd[0].disas_fn; *(uint32_t *)((long)ppAVar15 + -4) != 0;
        ppAVar15 = ppAVar15 + 2) {
      if ((*(uint32_t *)((long)ppAVar15 + -4) & uVar11) ==
          ((AArch64DecodeTable *)(ppAVar15 + -1))->pattern) {
        if (*ppAVar15 != (AArch64DecodeFn *)0x0) {
          (**ppAVar15)(s,uVar11);
          goto switchD_0062a93b_caseD_4;
        }
        break;
      }
    }
    break;
  case 8:
  case 9:
    switch(uVar11 >> 0x17 & 0x3f) {
    case 0x20:
    case 0x21:
      pTVar34 = s->uc->tcg_ctx;
      uVar24 = (ulong)(uVar11 >> 0x1d & 3) | (long)(uVar40 << 0x28) >> 0x2b & 0xfffffffffffffffcU;
      uVar23 = uVar24 << 0xc;
      uVar40 = s->pc_curr & 0xfffffffffffff000;
      if (-1 < (int)uVar11) {
        uVar23 = uVar24;
        uVar40 = s->pc_curr;
      }
      pTVar13 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      uVar40 = uVar23 + uVar40;
LAB_0062896c:
      tcg_gen_movi_i64_aarch64(pTVar34,pTVar13,uVar40);
      goto switchD_0062a93b_caseD_4;
    case 0x22:
    case 0x23:
      pTVar34 = s->uc->tcg_ctx;
      uVar9 = uVar11 >> 10 & 0xfff;
      pTVar13 = *(TCGv_i64 *)((long)pTVar34->cpu_X + (ulong)(uVar11 >> 2 & 0xf8));
      if ((uVar11 >> 0x1d & 1) == 0) {
        pTVar14 = pTVar34->cpu_X[uVar11 & 0x1f];
      }
      else {
        pTVar14 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      }
      if ((uVar11 >> 0x16 & 3) != 0) {
        if ((uVar11 >> 0x16 & 3) != 1) break;
        uVar9 = uVar9 << 0xc;
      }
      uVar40 = (ulong)uVar9;
      pTVar20 = tcg_temp_new_i64(pTVar34);
      if ((uVar11 >> 0x1d & 1) == 0) {
        if ((uVar11 >> 0x1e & 1) == 0) {
          tcg_gen_addi_i64_aarch64(pTVar34,pTVar20,pTVar13,uVar40);
        }
        else {
          tcg_gen_subi_i64_aarch64(pTVar34,pTVar20,pTVar13,uVar40);
        }
      }
      else {
        pTVar19 = tcg_const_i64_aarch64(pTVar34,uVar40);
        if ((uVar11 >> 0x1e & 1) == 0) {
          gen_add_CC(pTVar34,uVar11 >> 0x1f,pTVar20,pTVar13,pTVar19);
        }
        else {
          gen_sub_CC(pTVar34,uVar11 >> 0x1f,pTVar20,pTVar13,pTVar19);
        }
        tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar19 + (long)pTVar34));
      }
      if ((int)uVar11 < 0) {
        tcg_gen_mov_i64_aarch64(pTVar34,pTVar14,pTVar20);
      }
      else {
        tcg_gen_ext32u_i64_aarch64(pTVar34,pTVar14,pTVar20);
      }
      pTVar42 = (TCGTemp *)(pTVar20 + (long)pTVar34);
LAB_00629ba8:
      tcg_temp_free_internal_aarch64(pTVar34,pTVar42);
      goto switchD_0062a93b_caseD_4;
    case 0x24:
      if ((uVar11 >> 0x16 & 1) != 0 && -1 < (int)uVar11) {
LAB_00629ea7:
        unallocated_encoding_aarch64(s);
        goto switchD_0062a93b_caseD_4;
      }
      pTVar34 = s->uc->tcg_ctx;
      uVar9 = uVar11 >> 0x1d & 3;
      if (uVar9 == 3) {
        pTVar13 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      }
      else {
        pTVar13 = pTVar34->cpu_X[uVar11 & 0x1f];
      }
      pTVar14 = cpu_reg_aarch64(s,uVar11 >> 5 & 0x1f);
      _Var7 = logic_imm_decode_wmask_aarch64
                        ((uint64_t *)&local_78,uVar11 >> 0x16 & 1,uVar11 >> 10 & 0x3f,uVar33 & 0x3f)
      ;
      if (!_Var7) goto LAB_00629ea7;
      if (-1 < (int)uVar11) {
        local_78 = (TCGTemp *)((ulong)local_78 & 0xffffffff);
      }
      switch(uVar9) {
      default:
        tcg_gen_andi_i64_aarch64(pTVar34,pTVar13,pTVar14,(int64_t)local_78);
        goto LAB_0062a84e;
      case 1:
        tcg_gen_ori_i64_aarch64(pTVar34,pTVar13,pTVar14,(int64_t)local_78);
        break;
      case 2:
        tcg_gen_xori_i64_aarch64(pTVar34,pTVar13,pTVar14,(int64_t)local_78);
      }
      if (-1 < (int)uVar11) {
        tcg_gen_ext32u_i64_aarch64(pTVar34,pTVar13,pTVar13);
      }
LAB_0062a84e:
      if (uVar9 == 3) {
        gen_logic_CC(pTVar34,uVar11 >> 0x1f,pTVar13);
      }
      goto switchD_0062a93b_caseD_4;
    case 0x25:
      pTVar34 = s->uc->tcg_ctx;
      uVar9 = uVar11 >> 0x15 & 3;
      pTVar13 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      if (uVar9 < 2 || (int)uVar11 < 0) {
        uVar40 = (ulong)(uVar11 >> 5) & 0xffff;
        uVar9 = uVar9 << 4;
        switch(uVar11 >> 0x1d & 3) {
        default:
          uVar23 = -(ulong)((uVar11 >> 0x1d & 3) == 0) ^ uVar40 << (sbyte)uVar9;
          uVar40 = uVar23 & 0xffffffff;
          if ((int)uVar11 < 0) {
            uVar40 = uVar23;
          }
          goto LAB_0062896c;
        case 1:
          break;
        case 3:
          pTVar14 = tcg_const_i64_aarch64(pTVar34,uVar40);
          tcg_gen_deposit_i64_aarch64(pTVar34,pTVar13,pTVar13,pTVar14,uVar9,0x10);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar14 + (long)pTVar34));
joined_r0x0062ac73:
          pTVar14 = pTVar13;
          if ((int)uVar11 < 0) goto switchD_0062a93b_caseD_4;
LAB_0062ac86:
          tcg_gen_ext32u_i64_aarch64(pTVar34,pTVar14,pTVar13);
          goto switchD_0062a93b_caseD_4;
        }
      }
      break;
    case 0x26:
      uVar33 = uVar33 & 0x3f;
      iVar10 = ((int)uVar11 >> 0x1f) * -0x20;
      uVar9 = iVar10 + 0x20;
      if ((uVar33 <= uVar9 && uVar9 - uVar33 != 0) &&
          -((int)uVar11 >> 0x1f) == (uint)((uVar11 >> 0x16 & 1) != 0)) {
        uVar28 = uVar11 >> 0x1d;
        uVar45 = uVar28 & 3;
        uVar41 = uVar11 >> 10 & 0x3f;
        if (uVar41 < uVar9 && uVar45 != 3) {
          pTVar34 = s->uc->tcg_ctx;
          pTVar13 = cpu_reg_aarch64(s,uVar11 & 0x1f);
          pTVar14 = read_cpu_reg_aarch64(s,uVar11 >> 5 & 0x1f,1);
          if (uVar41 < uVar33) {
            uVar41 = uVar41 + 1;
            uVar9 = uVar9 - uVar33 & iVar10 + 0x1fU;
          }
          else {
            uVar41 = (uVar41 - uVar33) + 1;
            if (uVar45 == 2) {
              tcg_gen_extract_i64_aarch64(pTVar34,pTVar13,pTVar14,uVar33,uVar41);
              goto switchD_0062a93b_caseD_4;
            }
            if ((uVar28 & 3) == 0) {
              tcg_gen_sextract_i64_aarch64(pTVar34,pTVar13,pTVar14,uVar33,uVar41);
              goto joined_r0x0062ac73;
            }
            tcg_gen_shri_i64_aarch64(pTVar34,pTVar14,pTVar14,(ulong)uVar33);
            uVar9 = 0;
          }
          if (((uVar28 & 3) == 0) && (uVar41 < uVar33)) {
            tcg_gen_sextract_i64_aarch64(pTVar34,pTVar14,pTVar14,0,uVar41);
            uVar41 = uVar33;
          }
          else if (uVar45 == 1) {
            tcg_gen_deposit_i64_aarch64(pTVar34,pTVar13,pTVar13,pTVar14,uVar9,uVar41);
            goto joined_r0x0062ac73;
          }
          tcg_gen_deposit_z_i64_aarch64(pTVar34,pTVar13,pTVar14,uVar9,uVar41);
          goto switchD_0062a93b_caseD_4;
        }
      }
      goto switchD_0062938c_caseD_9;
    case 0x27:
      uVar9 = uVar11 >> 10 & 0x3f;
      if ((((uVar11 & 0x60200000) != 0) || (uVar11 >> 0x1f != (uVar11 >> 0x16 & 1))) ||
         (-1 < (int)uVar11 && 0x1f < uVar9)) break;
      pTVar34 = s->uc->tcg_ctx;
      pTVar14 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      pTVar13 = cpu_reg_aarch64(s,uVar33 & 0x1f);
      if ((uVar11 >> 10 & 0x3f) != 0) {
        uVar28 = uVar11 >> 5 & 0x1f;
        pTVar20 = cpu_reg_aarch64(s,uVar28);
        if ((int)uVar11 < 0) {
          tcg_gen_extract2_i64_aarch64(pTVar34,pTVar14,pTVar13,pTVar20,uVar9);
          goto switchD_0062a93b_caseD_4;
        }
        pTVar12 = tcg_temp_new_i32(pTVar34);
        tcg_gen_extrl_i64_i32_aarch64(pTVar34,pTVar12,pTVar13);
        if ((uVar33 & 0x1f) == uVar28) {
          tcg_gen_rotri_i32_aarch64(pTVar34,pTVar12,pTVar12,uVar9);
        }
        else {
          pTVar18 = tcg_temp_new_i32(pTVar34);
          tcg_gen_extrl_i64_i32_aarch64(pTVar34,pTVar18,pTVar20);
          tcg_gen_extract2_i32_aarch64(pTVar34,pTVar12,pTVar12,pTVar18,uVar9);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar18 + (long)pTVar34));
        }
        tcg_gen_extu_i32_i64_aarch64(pTVar34,pTVar14,pTVar12);
        pTVar42 = (TCGTemp *)(pTVar12 + (long)pTVar34);
        goto LAB_00629ba8;
      }
      if (-1 < (int)uVar11) goto LAB_0062ac86;
LAB_00629d21:
      tcg_gen_mov_i64_aarch64(pTVar34,pTVar14,pTVar13);
      goto switchD_0062a93b_caseD_4;
    }
    break;
  case 10:
  case 0xb:
    if ((uVar9 - 10 < 2) || (uVar9 - 0x4a < 2)) {
      tVar30 = s->pc_curr;
      if ((int)uVar11 < 0) {
        pTVar34 = s->uc->tcg_ctx;
        tcg_gen_movi_i64_aarch64(pTVar34,pTVar34->cpu_X[0x1e],(s->base).pc_next);
      }
      uVar16 = tVar30 + (long)((int)(uVar11 << 6) >> 4);
      reset_btype(s);
LAB_00628a49:
      iVar10 = 0;
LAB_00628df3:
      gen_goto_tb(s,iVar10,uVar16);
      goto switchD_0062a93b_caseD_4;
    }
    if (uVar9 == 0x1a) {
LAB_00628c99:
      pTVar34 = s->uc->tcg_ctx;
      uVar16 = (long)(int)((int)(uVar11 << 8) >> 0xb & 0xfffffffc) + s->pc_curr;
      pTVar13 = read_cpu_reg_aarch64(s,uVar11 & 0x1f,uVar11 >> 0x1f);
      pTVar17 = gen_new_label_aarch64(pTVar34);
      reset_btype(s);
      tcg_gen_brcondi_i64_aarch64
                (pTVar34,((uVar11 >> 0x18 & 1) != 0) + TCG_COND_EQ,pTVar13,0,pTVar17);
      gen_goto_tb(s,0,(s->base).pc_next);
      gen_set_label(pTVar34,pTVar17);
      iVar10 = 1;
      goto LAB_00628df3;
    }
    if (uVar9 == 0x1b) {
LAB_00628d27:
      pTVar34 = s->uc->tcg_ctx;
      uVar16 = (long)(int)((int)(short)(uVar11 >> 3) & 0xfffffffc) + s->pc_curr;
      pTVar13 = tcg_temp_new_i64(pTVar34);
      pTVar14 = cpu_reg_aarch64(s,uVar11 & 0x1f);
      tcg_gen_andi_i64_aarch64
                (pTVar34,pTVar13,pTVar14,1L << ((byte)(uVar11 >> 0x13) & 0x1f | bVar27 >> 2 & 0x20))
      ;
      pTVar17 = gen_new_label_aarch64(pTVar34);
      reset_btype(s);
      tcg_gen_brcondi_i64_aarch64
                (pTVar34,((uVar11 >> 0x18 & 1) != 0) + TCG_COND_EQ,pTVar13,0,pTVar17);
      tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar13 + (long)pTVar34));
      gen_goto_tb(s,0,(s->base).pc_next);
      gen_set_label(pTVar34,pTVar17);
      iVar10 = 1;
      goto LAB_00628df3;
    }
    if (uVar9 == 0x2a) {
      if ((uVar11 & 0x1000010) != 0) break;
      pTVar34 = s->uc->tcg_ctx;
      uVar16 = (long)(int)((int)(uVar11 << 8) >> 0xb & 0xfffffffc) + s->pc_curr;
      reset_btype(s);
      if (0xd < (uVar11 & 0xf)) goto LAB_00628a49;
      pTVar17 = gen_new_label_aarch64(pTVar34);
      arm_gen_test_cc_aarch64(pTVar34,uVar11 & 0xf,pTVar17);
      gen_goto_tb(s,0,(s->base).pc_next);
      gen_set_label(pTVar34,pTVar17);
      iVar10 = 1;
      goto LAB_00628df3;
    }
    if (uVar9 == 0x5a) goto LAB_00628c99;
    if (uVar9 == 0x5b) goto LAB_00628d27;
    if (uVar9 != 0x6a) {
      if (uVar9 != 0x6b) break;
      if ((~uVar11 & 0x1f0000) == 0) {
        uVar9 = uVar11 >> 0x15 & 0xf;
        if (uVar9 < 10) {
          pTVar34 = s->uc->tcg_ctx;
          uVar28 = uVar11 >> 10;
          uVar22 = uVar28 & 0x3f;
          uVar41 = uVar11 >> 5;
          uVar33 = uVar41 & 0x1f;
          uVar45 = uVar11 & 0x1f;
          switch(uVar9) {
          default:
            if (uVar22 - 2 < 2) {
              if ((pAVar4->id_aa64isar1 & 0xff000ff0) != 0) {
                if (uVar9 == 2) {
                  if ((uVar45 & uVar41) == 0x1f) {
                    pTVar14 = pTVar34->cpu_X[0x1f];
                    uVar33 = 0x1e;
LAB_0062af28:
                    uVar41 = uVar33;
                    if (s->pauth_active == true) {
                      pTVar13 = new_tmp_a64_aarch64(s);
                      pTVar25 = pTVar34->cpu_env;
                      pTVar20 = cpu_reg_aarch64(s,uVar33);
                      if (uVar22 == 2) {
                        gen_helper_autia(pTVar34,pTVar13,pTVar25,pTVar20,pTVar14);
                      }
                      else {
                        gen_helper_autib(pTVar34,pTVar13,pTVar25,pTVar20,pTVar14);
                      }
                    }
                    else {
                      pTVar13 = cpu_reg_aarch64(s,uVar33);
                    }
                    goto LAB_0062b849;
                  }
                }
                else if (uVar45 == 0x1f) {
                  pTVar14 = new_tmp_a64_zero_aarch64(s);
                  goto LAB_0062af28;
                }
              }
            }
            else if (((uVar28 & 0x3f) == 0) && ((uVar11 & 0x1f) == 0)) {
              pTVar13 = cpu_reg_aarch64(s,uVar33);
              uVar41 = uVar41 & 0x1f;
LAB_0062b849:
              gen_a64_set_pc(s,pTVar13);
              if (uVar9 != 1) goto LAB_0062b87f;
LAB_0062b85a:
              tcg_gen_movi_i64_aarch64(pTVar34,s->uc->tcg_ctx->cpu_X[0x1e],(s->base).pc_next);
LAB_0062b8b1:
              if ((s->isar->id_aa64pfr1 & 0xf) != 0) {
                uVar8 = 2;
LAB_0062b8be:
                pTVar34 = s->uc->tcg_ctx;
                pTVar12 = tcg_const_i32_aarch64(pTVar34,uVar8);
                tcg_gen_st_i32(pTVar34,pTVar12,pTVar34->cpu_env,0x228);
                tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
                s->btype = -1;
              }
              goto LAB_0062b906;
            }
            break;
          case 3:
          case 6:
          case 7:
            break;
          case 4:
            if (s->current_el != 0) {
              if (uVar22 - 2 < 2) {
                if (((uVar45 & uVar41) == 0x1f) && ((pAVar4->id_aa64isar1 & 0xff000ff0) != 0)) {
                  pTVar13 = tcg_temp_new_i64(pTVar34);
                  tcg_gen_ld_i64_aarch64
                            (pTVar34,pTVar13,pTVar34->cpu_env,(long)s->current_el * 8 + 0x238);
                  if (s->pauth_active == true) {
                    if (uVar22 == 2) {
                      gen_helper_autia(pTVar34,pTVar13,pTVar34->cpu_env,pTVar13,pTVar34->cpu_X[0x1f]
                                      );
                    }
                    else {
                      gen_helper_autib(pTVar34,pTVar13,pTVar34->cpu_env,pTVar13,pTVar34->cpu_X[0x1f]
                                      );
                    }
                  }
LAB_0062b9ff:
                  local_78 = (TCGTemp *)(pTVar34->cpu_env + (long)pTVar34);
                  local_70 = (TCGTemp *)(pTVar13 + (long)pTVar34);
                  tcg_gen_callN_aarch64
                            (pTVar34,helper_exception_return_aarch64,(TCGTemp *)0x0,2,&local_78);
                  tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar13 + (long)pTVar34));
                  (s->base).is_jmp = DISAS_TARGET_9;
                  goto switchD_0062a93b_caseD_4;
                }
              }
              else if (((uVar28 & 0x3f) == 0) && ((uVar11 & 0x1f) == 0)) {
                pTVar13 = tcg_temp_new_i64(pTVar34);
                tcg_gen_ld_i64_aarch64
                          (pTVar34,pTVar13,pTVar34->cpu_env,(long)s->current_el * 8 + 0x238);
                goto LAB_0062b9ff;
              }
            }
            break;
          case 5:
            break;
          case 8:
          case 9:
            if (((uVar11 & 0xf800) == 0x800) && ((pAVar4->id_aa64isar1 & 0xff000ff0) != 0)) {
              uVar41 = uVar41 & 0x1f;
              if (s->pauth_active == true) {
                pTVar13 = new_tmp_a64_aarch64(s);
                pTVar14 = s->uc->tcg_ctx->cpu_X[uVar45];
                pTVar25 = pTVar34->cpu_env;
                pTVar20 = cpu_reg_aarch64(s,uVar41);
                if (uVar22 == 2) {
                  gen_helper_autia(pTVar34,pTVar13,pTVar25,pTVar20,pTVar14);
                }
                else {
                  gen_helper_autib(pTVar34,pTVar13,pTVar25,pTVar20,pTVar14);
                }
              }
              else {
                pTVar13 = cpu_reg_aarch64(s,uVar33);
              }
              gen_a64_set_pc(s,pTVar13);
              if (uVar9 == 9) goto LAB_0062b85a;
              uVar9 = uVar11 >> 0x15 & 1;
LAB_0062b87f:
              if (uVar9 == 1) goto LAB_0062b8b1;
              if ((uVar9 == 0) && ((s->isar->id_aa64pfr1 & 0xf) != 0)) {
                if ((uVar41 & 0xfffffffe) != 0x10) {
                  uVar8 = (uint)s->guarded_page * 2 + 1;
                }
                goto LAB_0062b8be;
              }
LAB_0062b906:
              (s->base).is_jmp = DISAS_TARGET_0;
              goto switchD_0062a93b_caseD_4;
            }
          }
        }
      }
      goto LAB_0062b4d2;
    }
    if ((uVar11 >> 0x18 & 1) == 0) {
      uVar9 = uVar11 >> 0x15 & 7;
      if ((ushort)uVar9 < 6) {
        pTVar34 = s->uc->tcg_ctx;
        uVar33 = uVar11 & 0x1f;
        uVar28 = uVar11 >> 5 & 0xffff;
        switch(uVar9) {
        case 0:
          if (uVar33 == 3) {
            if (s->current_el == 0) break;
            gen_a64_set_pc_im_aarch64(pTVar34,s->pc_curr);
            syndrome = uVar28 | 0x5e000000;
            pTVar12 = tcg_const_i32_aarch64(pTVar34,syndrome);
            local_78 = (TCGTemp *)(pTVar34->cpu_env + (long)pTVar34);
            local_70 = (TCGTemp *)(pTVar12 + (long)pTVar34);
            tcg_gen_callN_aarch64(pTVar34,helper_pre_smc_aarch64,(TCGTemp *)0x0,2,&local_78);
            tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
            gen_ss_advance(s);
            tVar30 = (s->base).pc_next;
            iVar10 = 0xd;
            uVar8 = 3;
          }
          else if (uVar33 == 2) {
            if (s->current_el == 0) break;
            gen_a64_set_pc_im_aarch64(pTVar34,s->pc_curr);
            local_78 = (TCGTemp *)(pTVar34->cpu_env + (long)pTVar34);
            tcg_gen_callN_aarch64(pTVar34,helper_pre_hvc_aarch64,(TCGTemp *)0x0,1,&local_78);
            gen_ss_advance(s);
            tVar30 = (s->base).pc_next;
            syndrome = uVar28 | 0x5a000000;
            iVar10 = 0xb;
            uVar8 = 2;
          }
          else {
            if (uVar33 != 1) goto LAB_0062b4d2;
            gen_ss_advance(s);
            tVar30 = (s->base).pc_next;
            syndrome = uVar28 | 0x56000000;
            if ((s->mmu_idx == ARMMMUIdx_SE10_0) && (s->secure_routed_to_el3 != false)) {
              uVar8 = 3;
            }
            else {
              uVar8 = 1;
              if (1 < s->current_el) {
                uVar8 = s->current_el;
              }
            }
            iVar10 = 2;
          }
          gen_exception_insn(s,tVar30,iVar10,syndrome,uVar8);
          goto switchD_0062a93b_caseD_4;
        case 1:
          if ((uVar11 & 0x1f) == 0) {
            gen_a64_set_pc_im_aarch64(pTVar34,s->pc_curr);
            pTVar12 = tcg_const_i32_aarch64(pTVar34,uVar28 | 0xf2000000);
            local_78 = (TCGTemp *)(pTVar34->cpu_env + (long)pTVar34);
            local_70 = (TCGTemp *)(pTVar12 + (long)pTVar34);
            tcg_gen_callN_aarch64
                      (pTVar34,helper_exception_bkpt_insn_aarch64,(TCGTemp *)0x0,2,&local_78);
            tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
            (s->base).is_jmp = DISAS_NORETURN;
            goto switchD_0062a93b_caseD_4;
          }
        }
      }
      break;
    }
    if ((uVar11 & 0xc00000) != 0) break;
    uVar45 = uVar11 >> 0x15 & 1;
    uVar9 = uVar11 >> 0x13;
    uVar33 = uVar33 & 7;
    uVar38 = uVar11 >> 0xc & 0xf;
    uVar28 = uVar11 >> 8;
    uVar41 = uVar11 >> 8;
    val_01 = uVar41 & 0xf;
    uVar37 = uVar11 >> 5 & 7;
    uVar22 = uVar11 & 0x1f;
    if ((uVar9 & 3) != 0) {
      pTVar34 = s->uc->tcg_ctx;
      plVar29 = (list_item *)(s->uc->hook + 1);
      local_e0._0_4_ = uVar9 & 3;
      bVar47 = (uVar9 & 3) == 1;
      bVar27 = (byte)uVar45;
      local_d0 = (TCGLabel *)0x0;
switchD_006298ec_default:
      do {
        do {
          plVar29 = plVar29->next;
          pTVar17 = local_d0;
          if ((plVar29 == (list_item *)0x0) || (val = plVar29->data, val == (void *)0x0))
          goto LAB_006299fd;
        } while ((*(char *)((long)val + 0x14) != '\0') ||
                (*(ulong *)((long)val + 0x18) <= *(ulong *)((long)val + 0x20) &&
                 (*(ulong *)((long)val + 0x20) < s->pc_curr ||
                 s->pc_curr < *(ulong *)((long)val + 0x18))));
        switch(*(undefined4 *)((long)val + 4)) {
        case 1:
          bVar6 = (byte)uVar9 >> 1;
          goto joined_r0x00629905;
        case 2:
          if ((uVar9 & 2) == 0 || bVar27 != 0) goto switchD_006298ec_default;
          break;
        case 3:
          if (!bVar47 || bVar27 != 0) goto switchD_006298ec_default;
          break;
        case 4:
          bVar6 = bVar47;
joined_r0x00629905:
          if ((bVar6 & bVar27) == 0) goto switchD_006298ec_default;
          break;
        default:
          goto switchD_006298ec_default;
        }
        s_00 = s->uc->tcg_ctx;
        pTVar17 = gen_new_label_aarch64(s_00);
        pTVar12 = tcg_temp_new_i32(s_00);
        pTVar18 = tcg_const_i32_aarch64(s_00,uVar11);
        pTVar13 = tcg_const_i64_aarch64(s_00,(int64_t)val);
        gen_a64_set_pc_im_aarch64(s_00,s->pc_curr);
        local_78 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
        local_70 = (TCGTemp *)(pTVar18 + (long)s_00);
        local_68 = (TCGTemp *)(pTVar13 + (long)s_00);
        tcg_gen_callN_aarch64
                  (s_00,helper_uc_hooksys64_aarch64,(TCGTemp *)(pTVar12 + (long)&s_00->pool_cur),3,
                   &local_78);
        tcg_gen_brcondi_i32_aarch64(s_00,TCG_COND_NE,pTVar12,0,pTVar17);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar12 + (long)&s_00->pool_cur));
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar18 + (long)s_00));
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar13 + (long)s_00));
      } while (pTVar17 == (TCGLabel *)0x0);
LAB_006299fd:
      local_d0 = pTVar17;
      val_00 = get_arm_cp_reginfo_aarch64
                         (s->cp_regs,
                          uVar37 + (uVar38 << 7 | uVar33 << 0xb | (uint)local_e0 << 0xe) +
                                   val_01 * 8 + 0x10130000);
      if ((val_00 == (ARMCPRegInfo_conflict *)0x0) ||
         (((uint)val_00->access >> (uVar45 + s->current_el * 2 & 0x1f) & 1) == 0)) {
        unallocated_encoding_aarch64(s);
        goto switchD_0062b205_caseD_0;
      }
      if (val_00->accessfn == (CPAccessFn_conflict *)0x0) {
        if ((val_00->type & 0x8000) != 0) {
          gen_a64_set_pc_im_aarch64(pTVar34,s->pc_curr);
        }
      }
      else {
        gen_a64_set_pc_im_aarch64(pTVar34,s->pc_curr);
        pTVar13 = tcg_const_i64_aarch64(pTVar34,(int64_t)val_00);
        pTVar12 = tcg_const_i32_aarch64
                            (pTVar34,(uVar38 << 10 |
                                     uVar33 << 0xe | (uint)local_e0 << 0x14 | uVar37 << 0x11) +
                                     val_01 * 2 | uVar22 << 5 | uVar45 | 0x62000000);
        pTVar18 = tcg_const_i32_aarch64(pTVar34,uVar45);
        local_78 = (TCGTemp *)(pTVar34->cpu_env + (long)pTVar34);
        local_70 = (TCGTemp *)(pTVar13 + (long)pTVar34);
        local_68 = (TCGTemp *)(pTVar12 + (long)pTVar34);
        local_60 = (TCGTemp *)(pTVar18 + (long)pTVar34);
        tcg_gen_callN_aarch64(pTVar34,helper_access_check_cp_reg_aarch64,(TCGTemp *)0x0,4,&local_78)
        ;
        tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar13 + (long)pTVar34));
        tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
        tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar18 + (long)pTVar34));
      }
      uVar11 = val_00->type;
      uVar9 = (uVar11 & 0xfffe0f01) - 0x101;
      switch(uVar9 * 0x1000000 | uVar9 >> 8) {
      case 0:
        break;
      default:
        if ((uVar11 >> 0xc & 1) != 0) {
          _Var7 = fp_access_check(s);
          if (!_Var7) goto LAB_0062a8d1;
          uVar11 = val_00->type;
        }
        if (((uVar11 >> 0xd & 1) != 0) && (_Var7 = sve_access_check_aarch64(s), !_Var7)) break;
        pTVar13 = cpu_reg_aarch64(s,uVar22);
        if (uVar45 == 0) {
          if ((val_00->type & 2U) != 0) goto LAB_0062a8d1;
          if (val_00->writefn != (CPWriteFn_conflict *)0x0) {
            pTVar14 = tcg_const_i64_aarch64(pTVar34,(int64_t)val_00);
            pTVar25 = pTVar34->cpu_env;
            local_68 = (TCGTemp *)(pTVar13 + (long)pTVar34);
            pcVar31 = helper_set_cp_reg64_aarch64;
            iVar10 = 3;
            pTVar42 = (TCGTemp *)0x0;
            goto LAB_0062b9e5;
          }
          tcg_gen_st_i64_aarch64(pTVar34,pTVar13,pTVar34->cpu_env,val_00->fieldoffset);
        }
        else if ((val_00->type & 2U) == 0) {
          if (val_00->readfn == (CPReadFn_conflict *)0x0) {
            tcg_gen_ld_i64_aarch64(pTVar34,pTVar13,pTVar34->cpu_env,val_00->fieldoffset);
          }
          else {
            pTVar14 = tcg_const_i64_aarch64(pTVar34,(int64_t)val_00);
            pTVar25 = pTVar34->cpu_env;
            pTVar42 = (TCGTemp *)(pTVar13 + (long)pTVar34);
            pcVar31 = helper_get_cp_reg64_aarch64;
            iVar10 = 2;
LAB_0062b9e5:
            local_78 = (TCGTemp *)(pTVar25 + (long)pTVar34);
            local_70 = (TCGTemp *)(pTVar14 + (long)pTVar34);
            tcg_gen_callN_aarch64(pTVar34,pcVar31,pTVar42,iVar10,&local_78);
            tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar14 + (long)pTVar34));
          }
        }
        else {
          tcg_gen_movi_i64_aarch64(pTVar34,pTVar13,val_00->resetvalue);
        }
        if (((((s->base).tb)->cflags & 0x20000) != 0) && ((val_00->type & 0x40) != 0)) {
          (s->base).is_jmp = DISAS_TARGET_1;
        }
        if ((uVar45 == 0) && ((val_00->type & 8) == 0)) {
          pTVar12 = tcg_const_i32_aarch64(pTVar34,s->current_el);
          gen_helper_rebuild_hflags_a64(pTVar34,pTVar34->cpu_env,pTVar12);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
          (s->base).is_jmp = DISAS_TARGET_1;
        }
        goto LAB_0062a8d1;
      case 2:
        pTVar13 = cpu_reg_aarch64(s,uVar22);
        if (uVar45 == 0) {
          gen_set_nzcv(pTVar34,pTVar13);
        }
        else {
          pTVar12 = tcg_temp_new_i32(pTVar34);
          pTVar18 = tcg_temp_new_i32(pTVar34);
          tcg_gen_andi_i32_aarch64(pTVar34,pTVar18,pTVar34->cpu_NF,-0x80000000);
          tcg_gen_setcondi_i32_aarch64(pTVar34,TCG_COND_EQ,pTVar12,pTVar34->cpu_ZF,0);
          tcg_gen_deposit_i32_aarch64(pTVar34,pTVar18,pTVar18,pTVar12,0x1e,1);
          tcg_gen_deposit_i32_aarch64(pTVar34,pTVar18,pTVar18,pTVar34->cpu_CF,0x1d,1);
          tcg_gen_shri_i32_aarch64(pTVar34,pTVar12,pTVar34->cpu_VF,0x1f);
          tcg_gen_deposit_i32_aarch64(pTVar34,pTVar18,pTVar18,pTVar12,0x1c,1);
          tcg_gen_extu_i32_i64_aarch64(pTVar34,pTVar13,pTVar18);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar18 + (long)pTVar34));
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
        }
        goto LAB_0062a8d1;
      case 3:
        pTVar13 = cpu_reg_aarch64(s,uVar22);
        tcg_gen_movi_i64_aarch64(pTVar34,pTVar13,(long)(s->current_el << 2));
        break;
      case 4:
        pTVar13 = cpu_reg_aarch64(s,uVar22);
        pTVar13 = clean_data_tbi(s,pTVar13);
        local_78 = (TCGTemp *)(pTVar34->cpu_env + (long)pTVar34);
        local_70 = (TCGTemp *)(pTVar13 + (long)pTVar34);
        tcg_gen_callN_aarch64(pTVar34,helper_dc_zva_aarch64,(TCGTemp *)0x0,2,&local_78);
      }
switchD_0062b205_caseD_0:
LAB_0062a8d1:
      may_gen_set_label(s,local_d0);
      goto switchD_0062a93b_caseD_4;
    }
    if (uVar22 != 0x1f || (uVar11 >> 0x15 & 1) != 0) break;
    if (uVar38 == 4) {
      pTVar34 = s->uc->tcg_ctx;
      iVar10 = uVar37 + uVar33 * 8;
      (s->base).is_jmp = DISAS_TOO_MANY;
      switch(iVar10) {
      case 0:
        if (((uVar28 & 0xf) == 0) && ((pAVar4->id_aa64isar0 & 0xf0000000000000) != 0)) {
          tcg_gen_xori_i32_aarch64(pTVar34,pTVar34->cpu_CF,pTVar34->cpu_CF,1);
LAB_0062bc74:
          (s->base).is_jmp = DISAS_NEXT;
          goto switchD_0062a93b_caseD_4;
        }
        break;
      case 1:
        if (((uVar28 & 0xf) == 0) && ((pAVar4->id_aa64isar0 & 0xe0000000000000) != 0)) {
          pTVar12 = tcg_temp_new_i32(pTVar34);
          tcg_gen_setcondi_i32_aarch64(pTVar34,TCG_COND_EQ,pTVar12,pTVar34->cpu_ZF,0);
          tcg_gen_or_i32(pTVar34,pTVar34->cpu_NF,pTVar34->cpu_CF,pTVar12);
          tcg_gen_subi_i32_aarch64(pTVar34,pTVar34->cpu_NF,pTVar34->cpu_NF,1);
          tcg_gen_and_i32(pTVar34,pTVar34->cpu_ZF,pTVar12,pTVar34->cpu_CF);
          tcg_gen_xori_i32_aarch64(pTVar34,pTVar34->cpu_ZF,pTVar34->cpu_ZF,1);
          tcg_gen_andc_i32_aarch64(pTVar34,pTVar34->cpu_VF,pTVar12,pTVar34->cpu_CF);
          tcg_gen_neg_i32(pTVar34,pTVar34->cpu_VF,pTVar34->cpu_VF);
          tcg_gen_or_i32(pTVar34,pTVar34->cpu_CF,pTVar34->cpu_CF,pTVar12);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
          goto LAB_0062bc74;
        }
        break;
      case 2:
        if (((uVar28 & 0xf) == 0) && ((pAVar4->id_aa64isar0 & 0xe0000000000000) != 0)) {
          tcg_gen_sari_i32_aarch64(pTVar34,pTVar34->cpu_VF,pTVar34->cpu_VF,0x1f);
          tcg_gen_andc_i32_aarch64(pTVar34,pTVar34->cpu_CF,pTVar34->cpu_CF,pTVar34->cpu_VF);
          tcg_gen_andc_i32_aarch64(pTVar34,pTVar34->cpu_ZF,pTVar34->cpu_ZF,pTVar34->cpu_VF);
          tcg_gen_movi_i32(pTVar34,pTVar34->cpu_NF,arg);
          tcg_gen_movi_i32(pTVar34,pTVar34->cpu_VF,arg_00);
          goto LAB_0062bc74;
        }
        break;
      case 3:
        if (((pAVar4->id_aa64mmfr2 & 0xf0) != 0) && (s->current_el != 0)) {
          if ((uVar11 >> 8 & 1) == 0) {
            uVar8 = 0x800000;
            goto LAB_0062bb7e;
          }
          uVar8 = 0x800000;
LAB_0062c08d:
          set_pstate_bits(pTVar34,uVar8);
LAB_0062c092:
          pTVar12 = tcg_const_i32_aarch64(pTVar34,s->current_el);
          gen_helper_rebuild_hflags_a64(pTVar34,pTVar34->cpu_env,pTVar12);
          pTVar42 = (TCGTemp *)(pTVar12 + (long)pTVar34);
          goto LAB_00629782;
        }
        break;
      case 4:
        if (((pAVar4->id_aa64mmfr1 & 0xf00000) != 0) && (s->current_el != 0)) {
          if ((uVar11 >> 8 & 1) != 0) {
            uVar8 = 0x400000;
            goto LAB_0062c08d;
          }
          uVar8 = 0x400000;
LAB_0062bb7e:
          clear_pstate_bits(pTVar34,uVar8);
          goto LAB_0062c092;
        }
        break;
      case 5:
        if (s->current_el != 0) {
          pTVar12 = tcg_const_i32_aarch64(pTVar34,uVar41 & 1);
          pTVar25 = pTVar34->cpu_env;
          pcVar31 = helper_msr_i_spsel_aarch64;
LAB_0062bcbb:
          local_78 = (TCGTemp *)(pTVar25 + (long)pTVar34);
          local_70 = (TCGTemp *)(pTVar12 + (long)pTVar34);
          tcg_gen_callN_aarch64(pTVar34,pcVar31,(TCGTemp *)0x0,2,&local_78);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
          goto switchD_0062a93b_caseD_4;
        }
        break;
      default:
        if (iVar10 == 0x1e) {
          pTVar12 = tcg_const_i32_aarch64(pTVar34,val_01);
          pTVar25 = pTVar34->cpu_env;
          pcVar31 = helper_msr_i_daifset_aarch64;
          goto LAB_0062bcbb;
        }
        if (iVar10 == 0x1f) {
          pTVar12 = tcg_const_i32_aarch64(pTVar34,val_01);
          local_78 = (TCGTemp *)(pTVar34->cpu_env + (long)pTVar34);
          local_70 = (TCGTemp *)(pTVar12 + (long)pTVar34);
          tcg_gen_callN_aarch64(pTVar34,helper_msr_i_daifclear_aarch64,(TCGTemp *)0x0,2,&local_78);
          tcg_temp_free_internal_aarch64(pTVar34,(TCGTemp *)(pTVar12 + (long)pTVar34));
          (s->base).is_jmp = DISAS_TARGET_1;
          goto switchD_0062a93b_caseD_4;
        }
      }
      goto LAB_0062b4d2;
    }
    if (uVar38 == 3) {
      if ((uVar33 != 3) || (5 < uVar37 - 2)) break;
      pTVar34 = s->uc->tcg_ctx;
      switch(uVar37) {
      case 2:
        pTVar13 = pTVar34->cpu_exclusive_addr;
        uVar40 = 0xffffffffffffffff;
        goto LAB_0062896c;
      case 3:
        break;
      default:
        TVar5 = TCG_BAR_SC|TCG_MO_ALL;
        if ((uVar41 & 3) == 2) {
          TVar5 = TCG_BAR_SC|TCG_MO_ST_ST;
        }
        mb_type = TCG_BAR_SC|TCG_MO_LD_ST|TCG_MO_LD_LD;
        if ((uVar41 & 3) != 1) {
          mb_type = TVar5;
        }
        goto LAB_0062b5c1;
      case 6:
        reset_btype(s);
LAB_0062bcfd:
        uVar16 = (s->base).pc_next;
        iVar10 = 0;
        goto LAB_00628df3;
      case 7:
        if (((uVar28 & 0xf) == 0) && ((pAVar4->id_aa64isar1 & 0xf000000000) != 0)) {
          tcg_gen_mb_aarch64(pTVar34,TCG_BAR_SC|TCG_MO_ALL);
          goto LAB_0062bcfd;
        }
      }
      break;
    }
    if ((uVar38 != 2) || (uVar33 != 3)) break;
    iVar10 = uVar37 + val_01 * 8;
    if (0x1e < iVar10 - 1U) goto switchD_0062a93b_caseD_4;
    pTVar34 = s->uc->tcg_ctx;
    switch(iVar10) {
    case 1:
      if ((((s->base).tb)->cflags & 0x80000) == 0) {
        (s->base).is_jmp = DISAS_TARGET_7;
      }
      break;
    case 2:
      if ((((s->base).tb)->cflags & 0x80000) == 0) {
        (s->base).is_jmp = DISAS_TARGET_4;
      }
      break;
    case 3:
      (s->base).is_jmp = DISAS_TARGET_2;
      break;
    case 7:
      if (s->pauth_active == true) {
        gen_helper_xpaci(pTVar34,pTVar34->cpu_X[0x1e],pTVar34->cpu_env,pTVar34->cpu_X[0x1e]);
      }
      break;
    case 8:
      if (s->pauth_active != true) break;
      pTVar14 = pTVar34->cpu_X[0x11];
      pTVar25 = pTVar34->cpu_env;
      pTVar13 = pTVar34->cpu_X[0x10];
      goto LAB_0062c071;
    case 10:
      if (s->pauth_active != true) break;
      pTVar13 = pTVar34->cpu_X[0x11];
      pTVar25 = pTVar34->cpu_env;
      pTVar14 = pTVar34->cpu_X[0x10];
      goto LAB_0062bea2;
    case 0xc:
      if (s->pauth_active != true) break;
      pTVar14 = pTVar34->cpu_X[0x11];
      pTVar25 = pTVar34->cpu_env;
      pTVar13 = pTVar34->cpu_X[0x10];
      goto LAB_0062bf25;
    case 0xe:
      if (s->pauth_active != true) break;
      pTVar13 = pTVar34->cpu_X[0x11];
      pTVar25 = pTVar34->cpu_env;
      pTVar14 = pTVar34->cpu_X[0x10];
      goto LAB_0062c034;
    case 0x18:
      if (s->pauth_active != true) break;
      pTVar14 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar13 = new_tmp_a64_zero_aarch64(s);
      goto LAB_0062c071;
    case 0x19:
      if (s->pauth_active != true) break;
      pTVar14 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar13 = pTVar34->cpu_X[0x1f];
LAB_0062c071:
      gen_helper_pacia(pTVar34,pTVar14,pTVar25,pTVar14,pTVar13);
      break;
    case 0x1a:
      if (s->pauth_active != true) break;
      pTVar13 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar14 = new_tmp_a64_zero_aarch64(s);
      goto LAB_0062bea2;
    case 0x1b:
      if (s->pauth_active != true) break;
      pTVar13 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar14 = pTVar34->cpu_X[0x1f];
LAB_0062bea2:
      gen_helper_pacib(pTVar34,pTVar13,pTVar25,pTVar13,pTVar14);
      break;
    case 0x1c:
      if (s->pauth_active != true) break;
      pTVar14 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar13 = new_tmp_a64_zero_aarch64(s);
      goto LAB_0062bf25;
    case 0x1d:
      if (s->pauth_active != true) break;
      pTVar14 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar13 = pTVar34->cpu_X[0x1f];
LAB_0062bf25:
      gen_helper_autia(pTVar34,pTVar14,pTVar25,pTVar14,pTVar13);
      break;
    case 0x1e:
      if (s->pauth_active != true) break;
      pTVar13 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar14 = new_tmp_a64_zero_aarch64(s);
      goto LAB_0062c034;
    case 0x1f:
      if (s->pauth_active != true) break;
      pTVar13 = pTVar34->cpu_X[0x1e];
      pTVar25 = pTVar34->cpu_env;
      pTVar14 = pTVar34->cpu_X[0x1f];
LAB_0062c034:
      gen_helper_autib(pTVar34,pTVar13,pTVar25,pTVar13,pTVar14);
    }
    goto switchD_0062a93b_caseD_4;
  }
switchD_00628654_caseD_0:
LAB_0062b4d2:
  unallocated_encoding_aarch64(s);
switchD_0062a93b_caseD_4:
  pTVar34 = s->uc->tcg_ctx;
  for (lVar44 = 0; lVar44 < s->tmp_a64_count; lVar44 = lVar44 + 1) {
    tcg_temp_free_internal_aarch64
              (pTVar34,(TCGTemp *)((long)&pTVar34->pool_cur + (long)s->tmp_a64[lVar44]));
  }
  s->tmp_a64_count = 0;
  if (('\0' < s->btype) && ((s->base).is_jmp != DISAS_NORETURN)) {
    reset_btype(s);
  }
  return;
switchD_0062938c_caseD_9:
  goto switchD_00628654_caseD_0;
}

Assistant:

static void disas_a64_insn(CPUARMState *env, DisasContext *s)
{
    uint32_t insn;

    s->pc_curr = s->base.pc_next;
    insn = arm_ldl_code(env, s->base.pc_next, s->sctlr_b);

    s->insn = insn;
    s->base.pc_next += 4;

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(env->uc, UC_HOOK_CODE, s->pc_curr)) {

        // Sync PC in advance
        TCGContext *tcg_ctx = env->uc->tcg_ctx;
        gen_a64_set_pc_im(tcg_ctx, s->pc_curr);

        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, env->uc, s->pc_curr);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    s->fp_access_checked = false;

    if (dc_isar_feature(aa64_bti, s)) {
        if (s->base.num_insns == 1) {
            /*
             * At the first insn of the TB, compute s->guarded_page.
             * We delayed computing this until successfully reading
             * the first insn of the TB, above.  This (mostly) ensures
             * that the softmmu tlb entry has been populated, and the
             * page table GP bit is available.
             *
             * Note that we need to compute this even if btype == 0,
             * because this value is used for BR instructions later
             * where ENV is not available.
             */
            s->guarded_page = is_guarded_page(env, s);

            /* First insn can have btype set to non-zero.  */
            tcg_debug_assert(s->btype >= 0);

            /*
             * Note that the Branch Target Exception has fairly high
             * priority -- below debugging exceptions but above most
             * everything else.  This allows us to handle this now
             * instead of waiting until the insn is otherwise decoded.
             */
            if (s->btype != 0
                && s->guarded_page
                && !btype_destination_ok(insn, s->bt, s->btype)) {
                gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                                   syn_btitrap(s->btype),
                                   default_exception_el(s));
                return;
            }
        } else {
            /* Not the first insn: btype must be 0.  */
            tcg_debug_assert(s->btype == 0);
        }
    }

    switch (extract32(insn, 25, 4)) {
    case 0x0: case 0x1: case 0x3: /* UNALLOCATED */
        unallocated_encoding(s);
        break;
    case 0x2:
        if (!dc_isar_feature(aa64_sve, s) || !disas_sve(s, insn)) {
            unallocated_encoding(s);
        }
        break;
    case 0x8: case 0x9: /* Data processing - immediate */
        disas_data_proc_imm(s, insn);
        break;
    case 0xa: case 0xb: /* Branch, exception generation and system insns */
        disas_b_exc_sys(s, insn);
        break;
    case 0x4:
    case 0x6:
    case 0xc:
    case 0xe:      /* Loads and stores */
        disas_ldst(s, insn);
        break;
    case 0x5:
    case 0xd:      /* Data processing - register */
        disas_data_proc_reg(s, insn);
        break;
    case 0x7:
    case 0xf:      /* Data processing - SIMD and floating point */
        disas_data_proc_simd_fp(s, insn);
        break;
    default:
        assert(FALSE); /* all 15 cases should be handled above */
        break;
    }

    /* if we allocated any temporaries, free them here */
    free_tmp_a64(s);

    /*
     * After execution of most insns, btype is reset to 0.
     * Note that we set btype == -1 when the insn sets btype.
     */
    if (s->btype > 0 && s->base.is_jmp != DISAS_NORETURN) {
        reset_btype(s);
    }
}